

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O3

void rtr_bgpsec_free(rtr_bgpsec *bgpsec)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bgpsec->path != (rtr_secure_path_seg *)0x0) {
    rtr_bgpsec_free_secure_path(bgpsec->path);
  }
  if (bgpsec->sigs != (rtr_signature_seg *)0x0) {
    rtr_bgpsec_free_signatures(bgpsec->sigs);
  }
  if (bgpsec->nlri != (rtr_bgpsec_nlri *)0x0) {
    rtr_bgpsec_nlri_free(bgpsec->nlri);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    lrtr_free(bgpsec);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rtr_bgpsec_free(struct rtr_bgpsec *bgpsec)
{
	if (bgpsec->path)
		rtr_bgpsec_free_secure_path(bgpsec->path);
	if (bgpsec->sigs)
		rtr_bgpsec_free_signatures(bgpsec->sigs);
	if (bgpsec->nlri)
		rtr_bgpsec_nlri_free(bgpsec->nlri);
	lrtr_free(bgpsec);
}